

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O2

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
::readFromFile(IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *this,char *filename,Index rows,Index cols,bool withTimeStamp)

{
  uint uVar1;
  char cVar2;
  Index i;
  long row;
  Index j;
  long col;
  int k;
  Matrix m;
  ifstream f;
  uint auStack_218 [122];
  
  reset(this);
  std::ifstream::ifstream(&f);
  std::ifstream::open((char *)&f,(_Ios_Openmode)filename);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
              ((ConstantReturnType *)&k,rows,cols);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&m,
               (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)&k);
    k = 0;
    if (cols < 1) {
      cols = 0;
    }
    if (rows < 1) {
      rows = 0;
    }
    do {
      if (withTimeStamp) {
        std::istream::operator>>((istream *)&f,&k);
      }
      uVar1 = *(uint *)((long)auStack_218 + *(long *)(_f + -0x18));
      if ((uVar1 & 5) != 0) break;
      for (row = 0; row != rows; row = row + 1) {
        for (col = 0; cols != col; col = col + 1) {
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&m,row,col);
          std::istream::_M_extract<double>((double *)&f);
        }
      }
      setValue(this,(Matrix<double,__1,__1,_0,__1,__1> *)&m,(long)k);
      k = k + 1;
    } while ((uVar1 & 5) == 0);
    free(m.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  }
  std::ifstream::~ifstream(&f);
  return;
}

Assistant:

void IndexedMatrixArrayT<MatrixType, Allocator>::readFromFile(const char * filename, Index rows, Index cols, bool withTimeStamp)
{
  reset();

  std::ifstream f;

  f.open(filename);

  if (f.is_open())
  {

    Matrix m(Matrix::Zero(rows,cols));

    bool continuation=true;
    int k=0;

    while (continuation)
    {


      if (withTimeStamp)
      {
        f >> k;
      }


      if (f.fail())
        continuation=false;
      else
      {
        for (Index i = 0 ; i<rows; ++i)
        {
          for (Index j = 0 ; j<cols; ++j)
          {
            f >> m(i,j);
          }
        }

        setValue(m,k);
        ++k;
      }
    }
  }
}